

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool ONX_ModelPrivate::GetEntireRDKDocument
               (ONX_Model_UserData *docud,ON_wString *xml,ONX_Model *model)

{
  bool bVar1;
  int iVar2;
  size_t count;
  char *pcVar3;
  wchar_t *sWideChar;
  undefined1 local_358 [24];
  ON_EmbeddedFile ef;
  int i;
  int num_embedded_files;
  int wideLength;
  uint error_status;
  char *sArray;
  ON_String s;
  size_t length_so_far;
  int local_280;
  int utf8_length;
  ON__UINT32 local_26c;
  undefined1 local_268 [4];
  int version;
  ON_Read3dmBufferArchive archive;
  ONX_Model *model_local;
  ON_wString *xml_local;
  ONX_Model_UserData *docud_local;
  
  archive.m_reserved4 = (ON__INT_PTR)model;
  bVar1 = IsRDKDocumentInformation(docud);
  if (!bVar1) {
    docud_local._7_1_ = 0;
    goto LAB_006033f0;
  }
  ON_Read3dmBufferArchive::ON_Read3dmBufferArchive
            ((ON_Read3dmBufferArchive *)local_268,(long)(docud->m_goo).m_value,(docud->m_goo).m_goo,
             false,docud->m_usertable_3dm_version,docud->m_usertable_opennurbs_version);
  local_26c = 0;
  bVar1 = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)local_268,(ON__INT32 *)&local_26c);
  if (bVar1) {
    if (local_26c == 1) {
      bVar1 = ON_BinaryArchive::ReadString((ON_BinaryArchive *)local_268,xml);
      if (bVar1) {
LAB_006033a8:
        iVar2 = ON_wString::Length(xml);
        docud_local._7_1_ = 0 < iVar2;
        local_280 = 1;
      }
      else {
        docud_local._7_1_ = 0;
        local_280 = 1;
      }
    }
    else {
      if ((local_26c != 3) && (local_26c != 4)) goto LAB_006033a8;
      length_so_far._4_4_ = 0;
      bVar1 = ON_BinaryArchive::ReadInt
                        ((ON_BinaryArchive *)local_268,(ON__INT32 *)((long)&length_so_far + 4));
      if (bVar1) {
        if (length_so_far._4_4_ < 1) {
          docud_local._7_1_ = 0;
          local_280 = 1;
        }
        else {
          s.m_s = (char *)ArchiveLengthUpToEmbeddedFiles((long)length_so_far._4_4_);
          if ((char *)(long)(docud->m_goo).m_value < s.m_s) {
            docud_local._7_1_ = 0;
            local_280 = 1;
          }
          else {
            ON_String::ON_String((ON_String *)&sArray);
            ON_String::SetLength((ON_String *)&sArray,(long)length_so_far._4_4_);
            count = (size_t)length_so_far._4_4_;
            pcVar3 = ON_String::Array((ON_String *)&sArray);
            bVar1 = ON_BinaryArchive::ReadChar((ON_BinaryArchive *)local_268,count,pcVar3);
            if (bVar1) {
              bVar1 = ON_String::IsNotEmpty((ON_String *)&sArray);
              if (bVar1) {
                _wideLength = ON_String::Array((ON_String *)&sArray);
                num_embedded_files = 0;
                iVar2 = ON_ConvertUTF8ToWideChar
                                  (0,_wideLength,-1,(wchar_t *)0x0,0,(uint *)&num_embedded_files,0,0
                                   ,(char **)0x0);
                if ((0 < iVar2) && (num_embedded_files == 0)) {
                  ON_wString::SetLength(xml,(long)iVar2);
                  pcVar3 = _wideLength;
                  sWideChar = ON_wString::Array(xml);
                  ON_ConvertUTF8ToWideChar
                            (0,pcVar3,-1,sWideChar,iVar2 + 1,(uint *)&num_embedded_files,0,0,
                             (char **)0x0);
                }
                if (num_embedded_files != 0) {
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                             ,0x1534,"","RDK xml document settings is not a valid UTF-8 string.");
                }
              }
              if ((archive.m_reserved4 != 0) &&
                 (RemoveAllEmbeddedFiles((ONX_Model *)archive.m_reserved4), local_26c == 4)) {
                ef.m_impl._4_4_ = 0;
                bVar1 = ON_BinaryArchive::ReadInt
                                  ((ON_BinaryArchive *)local_268,(ON__INT32 *)((long)&ef.m_impl + 4)
                                  );
                if (!bVar1) {
                  docud_local._7_1_ = 0;
                  local_280 = 1;
                  goto LAB_0060337e;
                }
                for (ef.m_impl._0_4_ = 0; (int)ef.m_impl < ef.m_impl._4_4_;
                    ef.m_impl._0_4_ = (int)ef.m_impl + 1) {
                  ON_EmbeddedFile::ON_EmbeddedFile((ON_EmbeddedFile *)(local_358 + 0x10));
                  ON_EmbeddedFile::Read
                            ((ON_EmbeddedFile *)(local_358 + 0x10),(ON_BinaryArchive *)local_268);
                  ONX_Model::AddModelComponent
                            ((ONX_Model *)local_358,(ON_ModelComponent *)archive.m_reserved4);
                  ON_ModelComponentReference::~ON_ModelComponentReference
                            ((ON_ModelComponentReference *)local_358);
                  ON_EmbeddedFile::~ON_EmbeddedFile((ON_EmbeddedFile *)(local_358 + 0x10));
                }
              }
              local_280 = 0;
            }
            else {
              docud_local._7_1_ = 0;
              local_280 = 1;
            }
LAB_0060337e:
            ON_String::~ON_String((ON_String *)&sArray);
            if (local_280 == 0) goto LAB_006033a8;
          }
        }
      }
      else {
        docud_local._7_1_ = 0;
        local_280 = 1;
      }
    }
  }
  else {
    docud_local._7_1_ = 0;
    local_280 = 1;
  }
  ON_Read3dmBufferArchive::~ON_Read3dmBufferArchive((ON_Read3dmBufferArchive *)local_268);
LAB_006033f0:
  return (bool)(docud_local._7_1_ & 1);
}

Assistant:

bool ONX_ModelPrivate::GetEntireRDKDocument(const ONX_Model_UserData& docud, ON_wString& xml, ONX_Model* model) // Static.
{
  if (!::IsRDKDocumentInformation(docud))
    return false;

  ON_Read3dmBufferArchive archive(docud.m_goo.m_value, docud.m_goo.m_goo, false, docud.m_usertable_3dm_version, docud.m_usertable_opennurbs_version);

  int version = 0;
  if (!archive.ReadInt(&version))
    return false;

  if (1 == version)
  {
    // Version 1 was a UTF-16 string.
    if (!archive.ReadString(xml))
      return false;
  }
  else
  if ((3 == version) || (4 == version))
  {
    // Version 4 files are exactly the same as version 3, but with the addition of embedded files.

    // Version 3 and 4 is a UTF-8 string.
    int utf8_length = 0;
    if (!archive.ReadInt(&utf8_length))
      return false;

    if (utf8_length <= 0)
      return false;

    const size_t length_so_far = ArchiveLengthUpToEmbeddedFiles(utf8_length);
    if (length_so_far > size_t(docud.m_goo.m_value))
      return false; // Sanity check.

    ON_String s;
    s.SetLength(utf8_length);
    if (!archive.ReadChar(utf8_length, s.Array()))
      return false;

    if (s.IsNotEmpty())
    {
      const char* sArray = s.Array();
      unsigned int error_status = 0;
      auto wideLength = ON_ConvertUTF8ToWideChar(false, sArray, -1, 0, 0, &error_status, 0, 0, 0);
      if ((wideLength > 0) && (0 == error_status))
      {
        xml.SetLength(wideLength);
        ON_ConvertUTF8ToWideChar(false, sArray, -1, xml.Array(), wideLength+1, &error_status, 0, 0, 0);
      }

      if (0 != error_status)
      {
        ON_ERROR("RDK xml document settings is not a valid UTF-8 string.");
      }
    }

    if (nullptr != model)
    {
      RemoveAllEmbeddedFiles(*model);

      if (4 == version)
      {
        // Read the number of embedded files.
        int num_embedded_files = 0;
        if (!archive.ReadInt(&num_embedded_files))
          return false;

        // Create an ON_EmbeddedFile object for each embedded file.
        for (int i = 0; i < num_embedded_files; i++)
        {
          // We keep the embedded file object even if it fails to load; then it will have an error flag set.
          // See ON_EmbeddedFile::Error().
          ON_EmbeddedFile ef;
          ef.Read(archive);
          model->AddModelComponent(ef);
        }
      }
    }
  }

  return xml.Length() > 0;
}